

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::Net::clear(Net *this)

{
  int iVar1;
  size_type sVar2;
  reference ppLVar3;
  long in_RDI;
  int dret;
  size_t i;
  ulong local_10;
  
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::clear
            ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)0x115e1c);
  local_10 = 0;
  while( true ) {
    sVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40));
    if (sVar2 <= local_10) break;
    ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                         local_10);
    iVar1 = (*(*ppLVar3)->_vptr_Layer[5])(*ppLVar3,in_RDI);
    if (iVar1 != 0) {
      fprintf(_stderr,"layer destroy_pipeline failed\n");
    }
    ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                         local_10);
    if (*ppLVar3 != (value_type)0x0) {
      (*(*ppLVar3)->_vptr_Layer[1])();
    }
    local_10 = local_10 + 1;
  }
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x115ee1);
  return;
}

Assistant:

void Net::clear()
{
#if NCNN_VULKAN
    destroy_pipeline();
#endif // NCNN_VULKAN

    blobs.clear();
    for (size_t i=0; i<layers.size(); i++)
    {
        int dret = layers[i]->destroy_pipeline(opt);
        if (dret != 0)
        {
            fprintf(stderr, "layer destroy_pipeline failed\n");
            // ignore anyway
        }

        delete layers[i];
    }
    layers.clear();

#if NCNN_VULKAN
    if (weight_vkallocator)
    {
        delete weight_vkallocator;
        weight_vkallocator = 0;
    }
    if (weight_staging_vkallocator)
    {
        delete weight_staging_vkallocator;
        weight_staging_vkallocator = 0;
    }
#endif // NCNN_VULKAN
}